

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_to_spectrum.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_cb36::FlooringOnLogarithm::Run
          (FlooringOnLogarithm *this,vector<double,_std::allocator<double>_> *input_and_output)

{
  reference pdVar1;
  iterator __first;
  iterator __last;
  vector<double,_std::allocator<double>_> *in_RDI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  double floor;
  double max_value;
  anon_class_8_1_a7ea132c in_stack_ffffffffffffffa0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffb0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffb8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_20;
  double local_18;
  
  std::vector<double,_std::allocator<double>_>::begin(in_RDI);
  std::vector<double,_std::allocator<double>_>::end(in_RDI);
  local_20 = std::
             max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                       (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  pdVar1 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*(&local_20);
  local_18 = *pdVar1;
  __result._M_current =
       (double *)
       (local_18 +
       (double)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  std::vector<double,_std::allocator<double>_>::begin(in_RDI);
  __first = std::vector<double,_std::allocator<double>_>::end(in_RDI);
  __last = std::vector<double,_std::allocator<double>_>::begin(in_RDI);
  std::
  transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,(anonymous_namespace)::FlooringOnLogarithm::Run(std::vector<double,std::allocator<double>>*)const::_lambda(double)_1_>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __first._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __last._M_current,__result,in_stack_ffffffffffffffa0);
  return true;
}

Assistant:

bool Run(std::vector<double>* input_and_output) const override {
    const double max_value(
        *std::max_element(input_and_output->begin(), input_and_output->end()));
    const double floor(max_value + relative_floor_);
    std::transform(input_and_output->begin(), input_and_output->end(),
                   input_and_output->begin(),
                   [floor](double x) { return std::max(x, floor); });
    return true;
  }